

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topological-sort.cpp
# Opt level: O0

void __thiscall
TopologicalSortTest_Singleton_Test::~TopologicalSortTest_Singleton_Test
          (TopologicalSortTest_Singleton_Test *this)

{
  TopologicalSortTest_Singleton_Test *this_local;
  
  ~TopologicalSortTest_Singleton_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(TopologicalSortTest, Singleton) {
  Graph graph(1);
  TopologicalOrders orders(graph);
  auto it = orders.begin();
  ASSERT_NE(it, orders.end());
  EXPECT_EQ(*it, std::vector<Index>{0});
  ++it;
  EXPECT_EQ(it, orders.end());
}